

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoteReporter.cpp
# Opt level: O3

void __thiscall jaegertracing::reporters::RemoteReporter::flush(RemoteReporter *this)

{
  Counter *pCVar1;
  uint uVar2;
  rep rVar3;
  
  uVar2 = (*((this->_sender)._M_t.
             super___uniq_ptr_impl<jaegertracing::Sender,_std::default_delete<jaegertracing::Sender>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::Sender_*,_std::default_delete<jaegertracing::Sender>_>
             .super__Head_base<0UL,_jaegertracing::Sender_*,_false>._M_head_impl)->_vptr_Sender[3])
                    ();
  if (0 < (int)uVar2) {
    pCVar1 = (this->_metrics->_reporterSuccess)._M_t.
             super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
             ._M_t.
             super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
             .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl;
    (*pCVar1->_vptr_Counter[2])(pCVar1,(ulong)uVar2);
  }
  rVar3 = std::chrono::_V2::steady_clock::now();
  (this->_lastFlush).__d.__r = rVar3;
  return;
}

Assistant:

void RemoteReporter::flush() noexcept
{
    try {
        const auto flushed = _sender->flush();
        if (flushed > 0) {
            _metrics.reporterSuccess().inc(flushed);
        }
    } catch (const Sender::Exception& ex) {
        _metrics.reporterFailure().inc(ex.numFailed());
        _logger.error(ex.what());
    }

    _lastFlush = Clock::now();
}